

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

size_t sorter_binary_insertion_find(int64_t *dst,int64_t x,size_t size)

{
  int val;
  int64_t cx;
  size_t r;
  size_t c;
  size_t l;
  size_t size_local;
  int64_t x_local;
  int64_t *dst_local;
  ulong local_8;
  
  l = 0;
  r = size - 1;
  c = r >> 1;
  if (x - *dst < 0) {
    local_8 = 0;
  }
  else {
    local_8 = r;
    if (x - dst[r] < 1) {
      cx = dst[c];
      do {
        if ((int)x - (int)cx < 0) {
          if (c - l < 2) {
            return c;
          }
          r = c;
        }
        else {
          if (r - c < 2) {
            return c + 1;
          }
          l = c;
        }
        c = l + (r - l >> 1);
        cx = dst[c];
      } while( true );
    }
  }
  return local_8;
}

Assistant:

static __inline size_t BINARY_INSERTION_FIND(SORT_TYPE *dst, const SORT_TYPE x,
                                             const size_t size) {
  size_t l, c, r;
  SORT_TYPE cx;
  l = 0;
  r = size - 1;
  c = r >> 1;

  /* check for out of bounds at the beginning. */
  if (SORT_CMP(x, dst[0]) < 0) {
    return 0;
  } else if (SORT_CMP(x, dst[r]) > 0) {
    return r;
  }

  cx = dst[c];

  while (1) {
    const int val = SORT_CMP(x, cx);

    if (val < 0) {
      if (c - l <= 1) {
        return c;
      }

      r = c;
    } else { /* allow = for stability. The binary search favors the right. */
      if (r - c <= 1) {
        return c + 1;
      }

      l = c;
    }

    c = l + ((r - l) >> 1);
    cx = dst[c];
  }
}